

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

void findOptimalFlags(char **FLAG,int height,int width,int *imax,int *jmax)

{
  char cVar1;
  void *pvVar2;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int *in_R8;
  bool bVar3;
  short *structureVec;
  int j;
  int i;
  int newWidth;
  int newHeight;
  int blockSize;
  int blockType;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  
  if ((((in_RDI != (long *)0x0) && (in_RCX != (int *)0x0)) && (in_R8 != (int *)0x0)) &&
     (((in_ESI != 0 && (in_EDX != 0)) &&
      (pvVar2 = malloc((long)(short)in_ESI << 1), pvVar2 != (void *)0x0)))) {
    for (local_38 = 0; local_38 < in_ESI; local_38 = local_38 + 1) {
      *(undefined2 *)((long)pvVar2 + (long)local_38 * 2) = 0;
    }
    for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
      cVar1 = *(char *)in_RDI[local_34];
      for (local_38 = 1; local_38 < in_ESI; local_38 = local_38 + 1) {
        if (*(char *)(in_RDI[local_34] + (long)local_38) != cVar1) {
          *(undefined2 *)((long)pvVar2 + (long)local_38 * 2) = 1;
          cVar1 = *(char *)(in_RDI[local_34] + (long)local_38);
        }
      }
    }
    local_28 = in_ESI;
    for (local_38 = 0; local_38 < in_ESI; local_38 = local_34 + local_38) {
      local_34 = 1;
      while( true ) {
        bVar3 = false;
        if (local_38 + local_34 < in_ESI) {
          bVar3 = *(short *)((long)pvVar2 + (long)(local_38 + local_34) * 2) == 0;
        }
        if (!bVar3) break;
        local_34 = local_34 + 1;
      }
      if (local_34 < local_28) {
        local_28 = local_34;
      }
      if (local_28 == 1) break;
    }
    free(pvVar2);
    local_2c = (in_ESI << 1) / local_28;
    if (local_2c < *in_R8) {
      local_2c = *in_R8;
    }
    pvVar2 = malloc((long)(short)in_EDX << 1);
    if (pvVar2 != (void *)0x0) {
      for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
        *(undefined2 *)((long)pvVar2 + (long)local_34 * 2) = 0;
      }
      for (local_38 = 0; local_38 < in_ESI; local_38 = local_38 + 1) {
        cVar1 = *(char *)(*in_RDI + (long)local_38);
        for (local_34 = 1; local_34 < in_EDX; local_34 = local_34 + 1) {
          if (*(char *)(in_RDI[local_34] + (long)local_38) != cVar1) {
            *(undefined2 *)((long)pvVar2 + (long)local_34 * 2) = 1;
          }
          cVar1 = *(char *)(in_RDI[local_34] + (long)local_38);
        }
      }
      local_28 = in_EDX;
      for (local_34 = 0; local_34 < in_EDX; local_34 = local_38 + local_34) {
        local_38 = 1;
        while( true ) {
          bVar3 = false;
          if (local_38 + local_34 < in_EDX) {
            bVar3 = *(short *)((long)pvVar2 + (long)(local_38 + local_34) * 2) == 0;
          }
          if (!bVar3) break;
          local_38 = local_38 + 1;
        }
        if (local_38 < local_28) {
          local_28 = local_38;
        }
        if (local_28 == 1) break;
      }
      free(pvVar2);
      local_30 = (in_EDX << 1) / local_28;
      if (local_30 < *in_RCX) {
        local_30 = *in_RCX;
      }
      *in_R8 = local_2c;
      *in_RCX = local_30;
    }
  }
  return;
}

Assistant:

void findOptimalFlags (char **FLAG, int height, int width, int *imax, int *jmax)
{
	if (!FLAG || !imax || !jmax)
		return;
	if (!height || !width)
		return;
	/* Find the structure size in y-direction */
	int blockType, blockSize = height;
	int newHeight, newWidth;
	int i, j;
	short *structureVec = malloc(((short)height)*sizeof(short));
	if (structureVec == NULL)
		return;
	for (j = 0; j < height; j++)
		structureVec[j] = 0;
	for (i = 0; i < width; i++)
	{
		blockType = FLAG[i][0];
		for (j = 1; j < height; j++)
		{
			if (FLAG[i][j] != blockType)
			{
				structureVec[j] = 1;
				blockType = FLAG[i][j];
			}
		}
	}
	for (j = 0; j < height; j+=i)
	{
		i = 1;
		while (j+i < height && structureVec[j+i] == 0)
		{
			i++;
		}
		if (i < blockSize)
			blockSize = i;
		if (blockSize == 1)
			break;
	}
	free(structureVec);
	/* Extract the height necessary to represent the image, but no less than *jmax */
	newHeight = (height * 2)/blockSize;
	if (newHeight < *jmax)
		newHeight = *jmax;
	/* Now do exactly the same thing for the x-direction */
	blockSize = width;
	structureVec = malloc((short)width*sizeof(short));
	if (structureVec == NULL)
		return;
	for (i = 0; i < width; i++)
		structureVec[i] = 0;
	for (j = 0; j < height; j++)
	{
		blockType = FLAG[0][j];
		for (i = 1; i < width; i++)
		{
			if (FLAG[i][j] != blockType)
				structureVec[i] = 1;
			blockType = FLAG[i][j];
		}
	}
	for (i = 0; i < width; i+=j)
	{
		j = 1;
		while (j+i < width && structureVec[j+i] == 0)
		{
			j++;
		}
		if (j < blockSize)
			blockSize = j;
		if (blockSize == 1)
			break;
	}
	free(structureVec);
	/* Extract the width necessary to represent the image, but no less than *imax */
	newWidth = (width * 2)/blockSize;
	if (newWidth < *imax)
		newWidth = *imax;
	*jmax = newHeight;
	*imax = newWidth;
	return;
}